

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O2

int bcf_sr_seek(bcf_srs_t *readers,char *seq,int pos)

{
  bcf_sr_regions_t *reg;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  reg = readers->regions;
  if (pos == 0 && seq == (char *)0x0) {
    uVar2 = 0;
    uVar3 = (ulong)(uint)reg->nseqs;
    if (reg->nseqs < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 * 0x18 - uVar2 != 0; uVar2 = uVar2 + 0x18) {
      *(undefined4 *)((long)&reg->regs->creg + uVar2) = 0xffffffff;
    }
    reg->iseq = 0;
    iVar4 = 0;
  }
  else {
    bcf_sr_regions_overlap(reg,seq,pos,pos);
    lVar5 = 0;
    iVar4 = 0;
    for (lVar6 = 0; lVar6 < readers->nreaders; lVar6 = lVar6 + 1) {
      iVar1 = _reader_seek((bcf_sr_t *)((long)&readers->readers->file + lVar5),seq,pos,0x7ffffffe);
      iVar4 = iVar4 + iVar1;
      lVar5 = lVar5 + 0x60;
    }
  }
  return iVar4;
}

Assistant:

int bcf_sr_seek(bcf_srs_t *readers, const char *seq, int pos)
{
    if ( !seq && !pos )
    {
        // seek to start
        bcf_sr_seek_start(readers);
        return 0;
    }

    bcf_sr_regions_overlap(readers->regions, seq, pos, pos);
    int i, nret = 0;
    for (i=0; i<readers->nreaders; i++)
    {
        nret += _reader_seek(&readers->readers[i],seq,pos,MAX_CSI_COOR-1);
    }
    return nret;
}